

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void btreeLeaveAll(sqlite3 *db)

{
  int *piVar1;
  Btree *p;
  long lVar2;
  long lVar3;
  
  if (0 < db->nDb) {
    lVar2 = 8;
    lVar3 = 0;
    do {
      p = *(Btree **)((long)&db->aDb->zDbSName + lVar2);
      if ((p != (Btree *)0x0) && (p->sharable != '\0')) {
        piVar1 = &p->wantToLock;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          unlockBtreeMutex(p);
        }
      }
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x20;
    } while (lVar3 < db->nDb);
  }
  return;
}

Assistant:

static void SQLITE_NOINLINE btreeLeaveAll(sqlite3 *db){
  int i;
  Btree *p;
  assert( sqlite3_mutex_held(db->mutex) );
  for(i=0; i<db->nDb; i++){
    p = db->aDb[i].pBt;
    if( p ) sqlite3BtreeLeave(p);
  }
}